

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O3

void __thiscall
antlr::NoViableAltException::NoViableAltException
          (NoViableAltException *this,RefToken *t,string *fileName_)

{
  TokenRef *pTVar1;
  int line_;
  int column_;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"NoViableAlt","");
  line_ = (*t->ref->ptr->_vptr_Token[3])();
  column_ = (*t->ref->ptr->_vptr_Token[2])();
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_48,fileName_,line_,column_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__NoViableAltException_00223ef8;
  pTVar1 = t->ref;
  if (pTVar1 != (TokenRef *)0x0) {
    pTVar1->count = pTVar1->count + 1;
  }
  (this->token).ref = pTVar1;
  (this->node).ref = (ASTRef *)0x0;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(
	RefToken t,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("NoViableAlt",fileName_,t->getLine(),t->getColumn()),
    token(t), node(nullASTptr)
{
}